

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O1

_Bool q_resize(queue *q,size_t size)

{
  ulong uVar1;
  uintptr_t *__dest;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (0x1ffffffffffffffe < size) goto LAB_001f8808;
  if (q->size == 0) {
    __assert_fail("q->size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-queue.c"
                  ,0x32,"_Bool q_resize(struct queue *, size_t)");
  }
  if (size < q->size - 1) {
    if ((q->head == q->tail) || (q->head <= size && q->tail <= size)) goto LAB_001f87ea;
    uVar5 = size + 1;
    __dest = (uintptr_t *)mem_alloc(size * 8 + 8);
    uVar1 = q->head;
    uVar2 = q->tail - uVar1;
    if (q->tail < uVar1 || uVar2 == 0) {
      uVar4 = q->size - uVar1;
      uVar2 = uVar5;
      if (uVar4 < uVar5) {
        uVar2 = uVar4;
      }
      memcpy(__dest,q->data + uVar1,uVar2 * 8);
      sVar3 = size;
      if (uVar4 <= size) {
        memcpy(__dest + uVar2,q->data,(uVar5 - uVar2) * 8);
      }
    }
    else {
      if (uVar2 < uVar5) {
        uVar5 = uVar2;
      }
      memcpy(__dest,q->data + uVar1,uVar5 << 3);
      sVar3 = q->tail - q->head;
    }
    q->tail = sVar3;
    q->head = 0;
    mem_free(q->data);
  }
  else {
LAB_001f87ea:
    __dest = (uintptr_t *)mem_realloc(q->data,size * 8 + 8);
  }
  q->data = __dest;
  q->size = size + 1;
LAB_001f8808:
  return 0x1ffffffffffffffe < size;
}

Assistant:

bool q_resize(struct queue *q, size_t size) {
	if (size > SIZE_MAX / sizeof(uintptr_t) - 1) {
		return true;
	}
	assert(q->size > 0);
	if (size < q->size - 1 && q->head != q->tail
			&& (q->head > size || q->tail > size)) {
		uintptr_t *new_data = mem_alloc(sizeof(uintptr_t) * (size + 1));

		if (q->tail > q->head) {
			memcpy(new_data, q->data + q->head,
				MIN(q->tail - q->head, size + 1)
				* sizeof(uintptr_t));
			q->tail -= q->head;
		} else {
			size_t head_sz = MIN(q->size - q->head, size + 1);

			memcpy(new_data, q->data + q->head, head_sz
				* sizeof(uintptr_t));
			if (head_sz < size + 1) {
				memcpy(new_data + head_sz, q->data,
					(size + 1 - head_sz)
					* sizeof(uintptr_t));
			}
			q->tail = size;
		}
		q->head = 0;
		mem_free(q->data);
		q->data = new_data;
	} else {
		q->data = mem_realloc(q->data, sizeof(uintptr_t) * (size + 1));
	}
	q->size = size + 1;
	return false;
}